

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O2

string * cfd::api::json::JsonMappingApi::DecodeRawTransaction
                   (string *__return_storage_ptr__,string *request_message)

{
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  *in_RCX;
  undefined1 local_28 [24];
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionJsonApi::DecodeRawTransaction;
  local_10 = std::
             _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
             ::_M_invoke;
  local_28._16_8_ =
       std::
       _Function_handler<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*),_void_(*)(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
       ::_M_manager;
  ExecuteDirectApi<cfd::api::json::DecodeRawTransactionRequest,cfd::api::json::DecodeRawTransactionResponse>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::DecodeRawTransaction(
    const std::string &request_message) {
  return ExecuteDirectApi<
      DecodeRawTransactionRequest,
      DecodeRawTransactionResponse>(
      request_message, TransactionJsonApi::DecodeRawTransaction);
}